

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void gc_scan_incref_child(JSRuntime *rt,JSGCObjectHeader *p)

{
  list_head *in_RSI;
  list_head *in_stack_ffffffffffffffe8;
  
  *(int *)&in_RSI->prev = *(int *)&in_RSI->prev + 1;
  if (*(int *)&in_RSI->prev == 1) {
    list_del((list_head *)&in_RSI->next);
    list_add_tail(in_RSI,in_stack_ffffffffffffffe8);
    *(byte *)((long)&in_RSI->prev + 4) = *(byte *)((long)&in_RSI->prev + 4) & 0xf;
  }
  return;
}

Assistant:

static void gc_scan_incref_child(JSRuntime *rt, JSGCObjectHeader *p)
{
    p->ref_count++;
    if (p->ref_count == 1) {
        /* ref_count was 0: remove from tmp_obj_list and add at the
           end of gc_obj_list */
        list_del(&p->link);
        list_add_tail(&p->link, &rt->gc_obj_list);
        p->mark = 0; /* reset the mark for the next GC call */
    }
}